

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  undefined8 *puVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar20;
  ushort uVar21;
  ushort uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  RTCRayQueryContext *pRVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  byte bVar45;
  float fVar46;
  float fVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  AABBNodeMB4D *node1;
  ulong uVar54;
  long lVar55;
  RTCFilterFunctionN p_Var56;
  ulong uVar57;
  long lVar58;
  Geometry *pGVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  undefined1 auVar65 [8];
  RTCIntersectArguments *pRVar66;
  ulong uVar67;
  NodeRef *pNVar68;
  ulong uVar69;
  ulong uVar70;
  undefined4 uVar71;
  ulong unaff_R12;
  size_t mask;
  ulong uVar72;
  ulong uVar73;
  bool bVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  byte bVar79;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  float fVar97;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar98;
  uint uVar99;
  float fVar100;
  uint uVar113;
  uint uVar114;
  vint4 ai;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar115;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  uint uVar117;
  uint uVar121;
  uint uVar122;
  vint4 ai_2;
  uint uVar123;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  uint uVar124;
  uint uVar130;
  uint uVar131;
  vint4 bi;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar132;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 ai_5;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar146;
  float fVar148;
  vint4 ai_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar155;
  uint uVar156;
  float fVar164;
  uint uVar166;
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  uint uVar165;
  uint uVar167;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  float fVar170;
  float fVar176;
  float fVar179;
  vint4 ai_7;
  float fVar169;
  float fVar183;
  undefined1 auVar171 [16];
  float fVar177;
  float fVar180;
  float fVar184;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  float fVar181;
  float fVar182;
  float fVar185;
  float fVar186;
  undefined1 auVar175 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar192 [16];
  float fVar198;
  float fVar199;
  float fVar203;
  float fVar204;
  float fVar208;
  float fVar209;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar231;
  float fVar232;
  vint4 bi_4;
  float fVar233;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar238;
  float fVar240;
  vint4 bi_2;
  undefined1 auVar235 [16];
  float fVar239;
  float fVar241;
  float fVar242;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar250;
  float fVar253;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar257;
  float fVar258;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  UVIdentity<4> mapUV;
  RTCFilterFunctionN local_bf8;
  int local_bdc;
  ulong local_bd8;
  ulong local_bd0;
  NodeRef *local_bc8;
  RayQueryContext *local_bc0;
  Geometry *local_bb8;
  Scene *local_bb0;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined8 local_b98;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  float fStack_b80;
  float fStack_b7c;
  long local_b78;
  ulong local_b70;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [8];
  float fStack_b30;
  float fStack_b2c;
  undefined1 local_b28 [8];
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  float fStack_b10;
  float fStack_b0c;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_aa8 [12];
  float fStack_a9c;
  PlueckerHitM<4,_embree::sse42::UVIdentity<4>_> hit;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_840;
  float fStack_83c;
  float fStack_810;
  float fStack_80c;
  NodeRef stack [244];
  
  auVar53 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar18 = ray->tfar, 0.0 <= fVar18)) {
    pNVar68 = stack + 1;
    aVar20 = (ray->dir).field_0.field_1;
    fVar19 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar44 = 0.0;
    if (0.0 <= fVar19) {
      fVar44 = fVar19;
    }
    auVar247._4_4_ = -(uint)(ABS(aVar20.y) < 1e-18);
    auVar247._0_4_ = -(uint)(ABS(aVar20.x) < 1e-18);
    auVar247._8_4_ = -(uint)(ABS(aVar20.z) < 1e-18);
    auVar247._12_4_ = -(uint)(ABS(aVar20.field_3.w) < 1e-18);
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar246 = divps(_DAT_01feca10,(undefined1  [16])aVar20);
    auVar247 = blendvps(auVar246,_DAT_0201c930,auVar247);
    fVar257 = auVar247._0_4_ * 0.99999964;
    fVar261 = auVar247._4_4_ * 0.99999964;
    fVar264 = auVar247._8_4_ * 0.99999964;
    fVar243 = auVar247._0_4_ * 1.0000004;
    fVar250 = auVar247._4_4_ * 1.0000004;
    fVar253 = auVar247._8_4_ * 1.0000004;
    fVar19 = (ray->org).field_0.m128[0];
    fVar46 = (ray->org).field_0.m128[1];
    fVar47 = (ray->org).field_0.m128[2];
    uVar57 = (ulong)(fVar257 < 0.0) << 4;
    uVar69 = (ulong)(fVar261 < 0.0) << 4 | 0x20;
    uVar73 = (ulong)(fVar264 < 0.0) << 4 | 0x40;
    uVar63 = uVar57 ^ 0x10;
    uVar72 = uVar69 ^ 0x10;
    auVar235._4_4_ = fVar44;
    auVar235._0_4_ = fVar44;
    auVar235._8_4_ = fVar44;
    auVar235._12_4_ = fVar44;
    auVar246._4_4_ = fVar18;
    auVar246._0_4_ = fVar18;
    auVar246._8_4_ = fVar18;
    auVar246._12_4_ = fVar18;
    local_bd8 = uVar69;
    local_bd0 = uVar57;
    local_bc0 = context;
    do {
      if (pNVar68 == stack) {
        return;
      }
      uVar62 = pNVar68[-1].ptr;
      pNVar68 = pNVar68 + -1;
      do {
        if ((uVar62 & 8) == 0) {
          fVar206 = (ray->dir).field_0.m128[3];
          uVar54 = uVar62 & 0xfffffffffffffff0;
          pfVar15 = (float *)(uVar54 + 0x80 + uVar57);
          pfVar14 = (float *)(uVar54 + 0x20 + uVar57);
          auVar134._0_4_ = ((*pfVar15 * fVar206 + *pfVar14) - fVar19) * fVar257;
          auVar134._4_4_ = ((pfVar15[1] * fVar206 + pfVar14[1]) - fVar19) * fVar257;
          auVar134._8_4_ = ((pfVar15[2] * fVar206 + pfVar14[2]) - fVar19) * fVar257;
          auVar134._12_4_ = ((pfVar15[3] * fVar206 + pfVar14[3]) - fVar19) * fVar257;
          pfVar16 = (float *)(uVar54 + 0x80 + uVar69);
          pfVar14 = (float *)(uVar54 + 0x20 + uVar69);
          pfVar17 = (float *)(uVar54 + 0x80 + uVar73);
          pfVar15 = (float *)(uVar54 + 0x20 + uVar73);
          auVar158._0_4_ = ((*pfVar16 * fVar206 + *pfVar14) - fVar46) * fVar261;
          auVar158._4_4_ = ((pfVar16[1] * fVar206 + pfVar14[1]) - fVar46) * fVar261;
          auVar158._8_4_ = ((pfVar16[2] * fVar206 + pfVar14[2]) - fVar46) * fVar261;
          auVar158._12_4_ = ((pfVar16[3] * fVar206 + pfVar14[3]) - fVar46) * fVar261;
          auVar125._0_4_ = ((*pfVar17 * fVar206 + *pfVar15) - fVar47) * fVar264;
          auVar125._4_4_ = ((pfVar17[1] * fVar206 + pfVar15[1]) - fVar47) * fVar264;
          auVar125._8_4_ = ((pfVar17[2] * fVar206 + pfVar15[2]) - fVar47) * fVar264;
          auVar125._12_4_ = ((pfVar17[3] * fVar206 + pfVar15[3]) - fVar47) * fVar264;
          auVar125 = maxps(auVar158,auVar125);
          auVar247 = maxps(auVar235,auVar134);
          auVar247 = maxps(auVar247,auVar125);
          pfVar16 = (float *)(uVar54 + 0x80 + uVar63);
          pfVar14 = (float *)(uVar54 + 0x20 + uVar63);
          pfVar17 = (float *)(uVar54 + 0x80 + uVar72);
          pfVar15 = (float *)(uVar54 + 0x20 + uVar72);
          auVar174._0_4_ = ((*pfVar16 * fVar206 + *pfVar14) - fVar19) * fVar243;
          auVar174._4_4_ = ((pfVar16[1] * fVar206 + pfVar14[1]) - fVar19) * fVar243;
          auVar174._8_4_ = ((pfVar16[2] * fVar206 + pfVar14[2]) - fVar19) * fVar243;
          auVar174._12_4_ = ((pfVar16[3] * fVar206 + pfVar14[3]) - fVar19) * fVar243;
          auVar133._0_4_ = ((*pfVar17 * fVar206 + *pfVar15) - fVar46) * fVar250;
          auVar133._4_4_ = ((pfVar17[1] * fVar206 + pfVar15[1]) - fVar46) * fVar250;
          auVar133._8_4_ = ((pfVar17[2] * fVar206 + pfVar15[2]) - fVar46) * fVar250;
          auVar133._12_4_ = ((pfVar17[3] * fVar206 + pfVar15[3]) - fVar46) * fVar250;
          pfVar15 = (float *)(uVar54 + 0x80 + (uVar73 ^ 0x10));
          pfVar14 = (float *)(uVar54 + 0x20 + (uVar73 ^ 0x10));
          auVar141._0_4_ = ((*pfVar15 * fVar206 + *pfVar14) - fVar47) * fVar253;
          auVar141._4_4_ = ((pfVar15[1] * fVar206 + pfVar14[1]) - fVar47) * fVar253;
          auVar141._8_4_ = ((pfVar15[2] * fVar206 + pfVar14[2]) - fVar47) * fVar253;
          auVar141._12_4_ = ((pfVar15[3] * fVar206 + pfVar14[3]) - fVar47) * fVar253;
          auVar134 = minps(auVar133,auVar141);
          auVar125 = minps(auVar246,auVar174);
          auVar125 = minps(auVar125,auVar134);
          bVar74 = auVar247._0_4_ <= auVar125._0_4_;
          bVar28 = auVar247._4_4_ <= auVar125._4_4_;
          bVar29 = auVar247._8_4_ <= auVar125._8_4_;
          bVar30 = auVar247._12_4_ <= auVar125._12_4_;
          if (((uint)uVar62 & 7) == 6) {
            bVar74 = (fVar206 < *(float *)(uVar54 + 0xf0) && *(float *)(uVar54 + 0xe0) <= fVar206)
                     && bVar74;
            bVar28 = (fVar206 < *(float *)(uVar54 + 0xf4) && *(float *)(uVar54 + 0xe4) <= fVar206)
                     && bVar28;
            bVar29 = (fVar206 < *(float *)(uVar54 + 0xf8) && *(float *)(uVar54 + 0xe8) <= fVar206)
                     && bVar29;
            bVar30 = (fVar206 < *(float *)(uVar54 + 0xfc) && *(float *)(uVar54 + 0xec) <= fVar206)
                     && bVar30;
          }
          auVar101._0_4_ = (uint)bVar74 * -0x80000000;
          auVar101._4_4_ = (uint)bVar28 * -0x80000000;
          auVar101._8_4_ = (uint)bVar29 * -0x80000000;
          auVar101._12_4_ = (uint)bVar30 * -0x80000000;
          uVar71 = movmskps((int)unaff_R12,auVar101);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar71);
        }
        if ((uVar62 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar75 = 4;
          }
          else {
            uVar54 = uVar62 & 0xfffffffffffffff0;
            lVar64 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
              }
            }
            iVar75 = 0;
            uVar62 = *(ulong *)(uVar54 + lVar64 * 8);
            uVar67 = unaff_R12 - 1 & unaff_R12;
            if (uVar67 != 0) {
              pNVar68->ptr = uVar62;
              lVar64 = 0;
              if (uVar67 != 0) {
                for (; (uVar67 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                }
              }
              uVar60 = uVar67 - 1;
              while( true ) {
                pNVar68 = pNVar68 + 1;
                uVar62 = *(ulong *)(uVar54 + lVar64 * 8);
                uVar60 = uVar60 & uVar67;
                if (uVar60 == 0) break;
                pNVar68->ptr = uVar62;
                lVar64 = 0;
                if (uVar60 != 0) {
                  for (; (uVar60 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                  }
                }
                uVar67 = uVar60 - 1;
              }
            }
          }
        }
        else {
          iVar75 = 6;
        }
      } while (iVar75 == 0);
      if (iVar75 == 6) {
        uVar54 = (ulong)((uint)uVar62 & 0xf);
        uVar67 = uVar54 - 8;
        bVar74 = uVar54 != 8;
        if (bVar74) {
          uVar62 = uVar62 & 0xfffffffffffffff0;
          uVar54 = 0;
          do {
            lVar64 = uVar54 * 0x90;
            fVar116 = ((ray->dir).field_0.m128[3] - *(float *)(uVar62 + 0x80 + lVar64)) *
                      *(float *)(uVar62 + 0x84 + lVar64);
            uVar60 = *(ulong *)(uVar62 + 0x20 + lVar64);
            auVar102._8_8_ = 0;
            auVar102._0_8_ = uVar60;
            uVar70 = *(ulong *)(uVar62 + 0x24 + lVar64);
            auVar126._8_8_ = 0;
            auVar126._0_8_ = uVar70;
            bVar31 = (byte)uVar70;
            bVar79 = (byte)uVar60;
            bVar32 = (byte)(uVar70 >> 8);
            bVar91 = (byte)(uVar60 >> 8);
            bVar33 = (byte)(uVar70 >> 0x10);
            bVar92 = (byte)(uVar60 >> 0x10);
            bVar34 = (byte)(uVar70 >> 0x18);
            bVar93 = (byte)(uVar60 >> 0x18);
            bVar35 = (byte)(uVar70 >> 0x20);
            bVar94 = (byte)(uVar60 >> 0x20);
            bVar36 = (byte)(uVar70 >> 0x28);
            bVar95 = (byte)(uVar60 >> 0x28);
            bVar37 = (byte)(uVar70 >> 0x30);
            bVar96 = (byte)(uVar60 >> 0x30);
            bVar45 = (byte)(uVar60 >> 0x38);
            bVar38 = (byte)(uVar70 >> 0x38);
            auVar80[0] = -((byte)((bVar31 < bVar79) * bVar31 | (bVar31 >= bVar79) * bVar79) ==
                          bVar79);
            auVar80[1] = -((byte)((bVar32 < bVar91) * bVar32 | (bVar32 >= bVar91) * bVar91) ==
                          bVar91);
            auVar80[2] = -((byte)((bVar33 < bVar92) * bVar33 | (bVar33 >= bVar92) * bVar92) ==
                          bVar92);
            auVar80[3] = -((byte)((bVar34 < bVar93) * bVar34 | (bVar34 >= bVar93) * bVar93) ==
                          bVar93);
            auVar80[4] = -((byte)((bVar35 < bVar94) * bVar35 | (bVar35 >= bVar94) * bVar94) ==
                          bVar94);
            auVar80[5] = -((byte)((bVar36 < bVar95) * bVar36 | (bVar36 >= bVar95) * bVar95) ==
                          bVar95);
            auVar80[6] = -((byte)((bVar37 < bVar96) * bVar37 | (bVar37 >= bVar96) * bVar96) ==
                          bVar96);
            auVar80[7] = -((byte)((bVar38 < bVar45) * bVar38 | (bVar38 >= bVar45) * bVar45) ==
                          bVar45);
            auVar80[8] = 0xff;
            auVar80[9] = 0xff;
            auVar80[10] = 0xff;
            auVar80[0xb] = 0xff;
            auVar80[0xc] = 0xff;
            auVar80[0xd] = 0xff;
            auVar80[0xe] = 0xff;
            auVar80[0xf] = 0xff;
            auVar247 = pmovzxbd(auVar102,auVar102);
            fVar206 = *(float *)(uVar62 + 0x38 + lVar64);
            fVar184 = *(float *)(uVar62 + 0x3c + lVar64);
            fVar208 = *(float *)(uVar62 + 0x40 + lVar64);
            fVar98 = *(float *)(uVar62 + 0x44 + lVar64);
            fVar187 = (float)auVar247._0_4_ * fVar98 + fVar206;
            fVar195 = (float)auVar247._4_4_ * fVar98 + fVar206;
            fVar200 = (float)auVar247._8_4_ * fVar98 + fVar206;
            fVar205 = (float)auVar247._12_4_ * fVar98 + fVar206;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = *(ulong *)(uVar62 + 0x50 + lVar64);
            auVar247 = pmovzxbd(auVar103,auVar103);
            fVar155 = *(float *)(uVar62 + 0x74 + lVar64);
            fVar164 = *(float *)(uVar62 + 0x68 + lVar64);
            auVar125 = pmovzxbd(auVar126,auVar126);
            fVar188 = (float)auVar125._0_4_ * fVar98 + fVar206;
            fVar196 = (float)auVar125._4_4_ * fVar98 + fVar206;
            fVar201 = (float)auVar125._8_4_ * fVar98 + fVar206;
            fVar206 = (float)auVar125._12_4_ * fVar98 + fVar206;
            auVar127._8_8_ = 0;
            auVar127._0_8_ = *(ulong *)(uVar62 + 0x54 + lVar64);
            auVar125 = pmovzxbd(auVar127,auVar127);
            auVar139._8_8_ = 0;
            auVar139._0_8_ = *(ulong *)(uVar62 + 0x28 + lVar64);
            auVar134 = pmovzxbd(auVar139,auVar139);
            fVar98 = *(float *)(uVar62 + 0x48 + lVar64);
            fVar168 = (float)auVar134._0_4_ * fVar98 + fVar184;
            fVar176 = (float)auVar134._4_4_ * fVar98 + fVar184;
            fVar179 = (float)auVar134._8_4_ * fVar98 + fVar184;
            fVar183 = (float)auVar134._12_4_ * fVar98 + fVar184;
            auVar140._8_8_ = 0;
            auVar140._0_8_ = *(ulong *)(uVar62 + 0x58 + lVar64);
            auVar141 = pmovzxbd(auVar140,auVar140);
            fVar181 = *(float *)(uVar62 + 0x78 + lVar64);
            fVar185 = *(float *)(uVar62 + 0x6c + lVar64);
            auVar171._8_8_ = 0;
            auVar171._0_8_ = *(ulong *)(uVar62 + 0x2c + lVar64);
            auVar134 = pmovzxbd(auVar171,auVar171);
            fVar169 = (float)auVar134._0_4_ * fVar98 + fVar184;
            fVar177 = (float)auVar134._4_4_ * fVar98 + fVar184;
            fVar180 = (float)auVar134._8_4_ * fVar98 + fVar184;
            fVar184 = (float)auVar134._12_4_ * fVar98 + fVar184;
            auVar157._8_8_ = 0;
            auVar157._0_8_ = *(ulong *)(uVar62 + 0x5c + lVar64);
            auVar158 = pmovzxbd(auVar157,auVar157);
            auVar172._8_8_ = 0;
            auVar172._0_8_ = *(ulong *)(uVar62 + 0x30 + lVar64);
            auVar134 = pmovzxbd(auVar172,auVar172);
            fVar98 = *(float *)(uVar62 + 0x4c + lVar64);
            fVar189 = (float)auVar134._0_4_ * fVar98 + fVar208;
            fVar197 = (float)auVar134._4_4_ * fVar98 + fVar208;
            fVar202 = (float)auVar134._8_4_ * fVar98 + fVar208;
            fVar207 = (float)auVar134._12_4_ * fVar98 + fVar208;
            auVar173._8_8_ = 0;
            auVar173._0_8_ = *(ulong *)(uVar62 + 0x60 + lVar64);
            auVar174 = pmovzxbd(auVar173,auVar173);
            fVar97 = *(float *)(uVar62 + 0x7c + lVar64);
            fVar100 = *(float *)(uVar62 + 0x70 + lVar64);
            auVar192._8_8_ = 0;
            auVar192._0_8_ = *(ulong *)(uVar62 + 0x34 + lVar64);
            auVar134 = pmovzxbd(auVar192,auVar192);
            fVar190 = (float)auVar134._0_4_ * fVar98 + fVar208;
            fVar198 = (float)auVar134._4_4_ * fVar98 + fVar208;
            fVar203 = (float)auVar134._8_4_ * fVar98 + fVar208;
            fVar208 = (float)auVar134._12_4_ * fVar98 + fVar208;
            auVar135._8_8_ = 0;
            auVar135._0_8_ = *(ulong *)(uVar62 + 100 + lVar64);
            auVar134 = pmovzxbd(auVar135,auVar135);
            fVar98 = (((((float)auVar247._0_4_ * fVar155 + fVar164) - fVar187) * fVar116 + fVar187)
                     - fVar19) * fVar257;
            fVar187 = (((((float)auVar247._4_4_ * fVar155 + fVar164) - fVar195) * fVar116 + fVar195)
                      - fVar19) * fVar257;
            fVar195 = (((((float)auVar247._8_4_ * fVar155 + fVar164) - fVar200) * fVar116 + fVar200)
                      - fVar19) * fVar257;
            fVar200 = (((((float)auVar247._12_4_ * fVar155 + fVar164) - fVar205) * fVar116 + fVar205
                       ) - fVar19) * fVar257;
            fVar205 = (((((float)auVar141._0_4_ * fVar181 + fVar185) - fVar168) * fVar116 + fVar168)
                      - fVar46) * fVar261;
            fVar146 = (((((float)auVar141._4_4_ * fVar181 + fVar185) - fVar176) * fVar116 + fVar176)
                      - fVar46) * fVar261;
            fVar148 = (((((float)auVar141._8_4_ * fVar181 + fVar185) - fVar179) * fVar116 + fVar179)
                      - fVar46) * fVar261;
            fVar183 = (((((float)auVar141._12_4_ * fVar181 + fVar185) - fVar183) * fVar116 + fVar183
                       ) - fVar46) * fVar261;
            fVar168 = (((((float)auVar125._0_4_ * fVar155 + fVar164) - fVar188) * fVar116 + fVar188)
                      - fVar19) * fVar243;
            fVar176 = (((((float)auVar125._4_4_ * fVar155 + fVar164) - fVar196) * fVar116 + fVar196)
                      - fVar19) * fVar243;
            fVar179 = (((((float)auVar125._8_4_ * fVar155 + fVar164) - fVar201) * fVar116 + fVar201)
                      - fVar19) * fVar243;
            fVar206 = (((((float)auVar125._12_4_ * fVar155 + fVar164) - fVar206) * fVar116 + fVar206
                       ) - fVar19) * fVar243;
            fVar155 = (((((float)auVar158._0_4_ * fVar181 + fVar185) - fVar169) * fVar116 + fVar169)
                      - fVar46) * fVar250;
            fVar164 = (((((float)auVar158._4_4_ * fVar181 + fVar185) - fVar177) * fVar116 + fVar177)
                      - fVar46) * fVar250;
            fVar169 = (((((float)auVar158._8_4_ * fVar181 + fVar185) - fVar180) * fVar116 + fVar180)
                      - fVar46) * fVar250;
            fVar184 = (((((float)auVar158._12_4_ * fVar181 + fVar185) - fVar184) * fVar116 + fVar184
                       ) - fVar46) * fVar250;
            uVar117 = (uint)((int)fVar168 < (int)fVar98) * (int)fVar168 |
                      (uint)((int)fVar168 >= (int)fVar98) * (int)fVar98;
            uVar121 = (uint)((int)fVar176 < (int)fVar187) * (int)fVar176 |
                      (uint)((int)fVar176 >= (int)fVar187) * (int)fVar187;
            uVar122 = (uint)((int)fVar179 < (int)fVar195) * (int)fVar179 |
                      (uint)((int)fVar179 >= (int)fVar195) * (int)fVar195;
            uVar123 = (uint)((int)fVar206 < (int)fVar200) * (int)fVar206 |
                      (uint)((int)fVar206 >= (int)fVar200) * (int)fVar200;
            uVar124 = (uint)((int)fVar168 < (int)fVar98) * (int)fVar98 |
                      (uint)((int)fVar168 >= (int)fVar98) * (int)fVar168;
            uVar130 = (uint)((int)fVar176 < (int)fVar187) * (int)fVar187 |
                      (uint)((int)fVar176 >= (int)fVar187) * (int)fVar176;
            uVar131 = (uint)((int)fVar179 < (int)fVar195) * (int)fVar195 |
                      (uint)((int)fVar179 >= (int)fVar195) * (int)fVar179;
            uVar132 = (uint)((int)fVar206 < (int)fVar200) * (int)fVar200 |
                      (uint)((int)fVar206 >= (int)fVar200) * (int)fVar206;
            uVar99 = (uint)((int)fVar155 < (int)fVar205) * (int)fVar155 |
                     (uint)((int)fVar155 >= (int)fVar205) * (int)fVar205;
            uVar113 = (uint)((int)fVar164 < (int)fVar146) * (int)fVar164 |
                      (uint)((int)fVar164 >= (int)fVar146) * (int)fVar146;
            uVar114 = (uint)((int)fVar169 < (int)fVar148) * (int)fVar169 |
                      (uint)((int)fVar169 >= (int)fVar148) * (int)fVar148;
            uVar115 = (uint)((int)fVar184 < (int)fVar183) * (int)fVar184 |
                      (uint)((int)fVar184 >= (int)fVar183) * (int)fVar183;
            uVar99 = ((int)uVar99 < (int)uVar117) * uVar117 | ((int)uVar99 >= (int)uVar117) * uVar99
            ;
            uVar113 = ((int)uVar113 < (int)uVar121) * uVar121 |
                      ((int)uVar113 >= (int)uVar121) * uVar113;
            uVar114 = ((int)uVar114 < (int)uVar122) * uVar122 |
                      ((int)uVar114 >= (int)uVar122) * uVar114;
            uVar115 = ((int)uVar115 < (int)uVar123) * uVar123 |
                      ((int)uVar115 >= (int)uVar123) * uVar115;
            uVar117 = (uint)((int)fVar155 < (int)fVar205) * (int)fVar205 |
                      (uint)((int)fVar155 >= (int)fVar205) * (int)fVar155;
            uVar121 = (uint)((int)fVar164 < (int)fVar146) * (int)fVar146 |
                      (uint)((int)fVar164 >= (int)fVar146) * (int)fVar164;
            uVar122 = (uint)((int)fVar169 < (int)fVar148) * (int)fVar148 |
                      (uint)((int)fVar169 >= (int)fVar148) * (int)fVar169;
            uVar123 = (uint)((int)fVar184 < (int)fVar183) * (int)fVar183 |
                      (uint)((int)fVar184 >= (int)fVar183) * (int)fVar184;
            fVar155 = (((((float)auVar174._0_4_ * fVar97 + fVar100) - fVar189) * fVar116 + fVar189)
                      - fVar47) * fVar264;
            fVar164 = (((((float)auVar174._4_4_ * fVar97 + fVar100) - fVar197) * fVar116 + fVar197)
                      - fVar47) * fVar264;
            fVar181 = (((((float)auVar174._8_4_ * fVar97 + fVar100) - fVar202) * fVar116 + fVar202)
                      - fVar47) * fVar264;
            fVar185 = (((((float)auVar174._12_4_ * fVar97 + fVar100) - fVar207) * fVar116 + fVar207)
                      - fVar47) * fVar264;
            fVar206 = (((((float)auVar134._0_4_ * fVar97 + fVar100) - fVar190) * fVar116 + fVar190)
                      - fVar47) * fVar253;
            fVar184 = (((((float)auVar134._4_4_ * fVar97 + fVar100) - fVar198) * fVar116 + fVar198)
                      - fVar47) * fVar253;
            fVar98 = (((((float)auVar134._8_4_ * fVar97 + fVar100) - fVar203) * fVar116 + fVar203) -
                     fVar47) * fVar253;
            fVar208 = (((((float)auVar134._12_4_ * fVar97 + fVar100) - fVar208) * fVar116 + fVar208)
                      - fVar47) * fVar253;
            uVar156 = ((int)uVar124 < (int)uVar117) * uVar124 |
                      ((int)uVar124 >= (int)uVar117) * uVar117;
            uVar165 = ((int)uVar130 < (int)uVar121) * uVar130 |
                      ((int)uVar130 >= (int)uVar121) * uVar121;
            uVar166 = ((int)uVar131 < (int)uVar122) * uVar131 |
                      ((int)uVar131 >= (int)uVar122) * uVar122;
            uVar167 = ((int)uVar132 < (int)uVar123) * uVar132 |
                      ((int)uVar132 >= (int)uVar123) * uVar123;
            uVar117 = (uint)((int)fVar206 < (int)fVar155) * (int)fVar206 |
                      (uint)((int)fVar206 >= (int)fVar155) * (int)fVar155;
            uVar121 = (uint)((int)fVar184 < (int)fVar164) * (int)fVar184 |
                      (uint)((int)fVar184 >= (int)fVar164) * (int)fVar164;
            uVar122 = (uint)((int)fVar98 < (int)fVar181) * (int)fVar98 |
                      (uint)((int)fVar98 >= (int)fVar181) * (int)fVar181;
            uVar123 = (uint)((int)fVar208 < (int)fVar185) * (int)fVar208 |
                      (uint)((int)fVar208 >= (int)fVar185) * (int)fVar185;
            uVar124 = (uint)((int)fVar206 < (int)fVar155) * (int)fVar155 |
                      (uint)((int)fVar206 >= (int)fVar155) * (int)fVar206;
            uVar130 = (uint)((int)fVar184 < (int)fVar164) * (int)fVar164 |
                      (uint)((int)fVar184 >= (int)fVar164) * (int)fVar184;
            uVar131 = (uint)((int)fVar98 < (int)fVar181) * (int)fVar181 |
                      (uint)((int)fVar98 >= (int)fVar181) * (int)fVar98;
            uVar132 = (uint)((int)fVar208 < (int)fVar185) * (int)fVar185 |
                      (uint)((int)fVar208 >= (int)fVar185) * (int)fVar208;
            uVar117 = (uint)((int)uVar117 < (int)fVar44) * (int)fVar44 |
                      ((int)uVar117 >= (int)fVar44) * uVar117;
            uVar121 = (uint)((int)uVar121 < (int)fVar44) * (int)fVar44 |
                      ((int)uVar121 >= (int)fVar44) * uVar121;
            uVar122 = (uint)((int)uVar122 < (int)fVar44) * (int)fVar44 |
                      ((int)uVar122 >= (int)fVar44) * uVar122;
            uVar123 = (uint)((int)uVar123 < (int)fVar44) * (int)fVar44 |
                      ((int)uVar123 >= (int)fVar44) * uVar123;
            uVar124 = (uint)((int)fVar18 < (int)uVar124) * (int)fVar18 |
                      ((int)fVar18 >= (int)uVar124) * uVar124;
            uVar130 = (uint)((int)fVar18 < (int)uVar130) * (int)fVar18 |
                      ((int)fVar18 >= (int)uVar130) * uVar130;
            uVar131 = (uint)((int)fVar18 < (int)uVar131) * (int)fVar18 |
                      ((int)fVar18 >= (int)uVar131) * uVar131;
            uVar132 = (uint)((int)fVar18 < (int)uVar132) * (int)fVar18 |
                      ((int)fVar18 >= (int)uVar132) * uVar132;
            auVar118._0_4_ =
                 -(uint)((int)(((int)uVar156 < (int)uVar124) * uVar156 |
                              ((int)uVar156 >= (int)uVar124) * uVar124) <
                        (int)(((int)uVar117 < (int)uVar99) * uVar99 |
                             ((int)uVar117 >= (int)uVar99) * uVar117));
            auVar118._4_4_ =
                 -(uint)((int)(((int)uVar165 < (int)uVar130) * uVar165 |
                              ((int)uVar165 >= (int)uVar130) * uVar130) <
                        (int)(((int)uVar121 < (int)uVar113) * uVar113 |
                             ((int)uVar121 >= (int)uVar113) * uVar121));
            auVar118._8_4_ =
                 -(uint)((int)(((int)uVar166 < (int)uVar131) * uVar166 |
                              ((int)uVar166 >= (int)uVar131) * uVar131) <
                        (int)(((int)uVar122 < (int)uVar114) * uVar114 |
                             ((int)uVar122 >= (int)uVar114) * uVar122));
            auVar118._12_4_ =
                 -(uint)((int)(((int)uVar167 < (int)uVar132) * uVar167 |
                              ((int)uVar167 >= (int)uVar132) * uVar132) <
                        (int)(((int)uVar123 < (int)uVar115) * uVar115 |
                             ((int)uVar123 >= (int)uVar115) * uVar123));
            auVar247 = pmovsxbd(auVar80,auVar80);
            uVar99 = movmskps((int)uVar54,~auVar118 & auVar247);
            if (uVar99 != 0) {
              lVar64 = lVar64 + uVar62;
              uVar60 = (ulong)(uVar99 & 0xff);
              local_bc8 = pNVar68;
              do {
                auVar247 = _local_aa8;
                lVar27 = 0;
                if (uVar60 != 0) {
                  for (; (uVar60 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                uVar21 = *(ushort *)(lVar64 + lVar27 * 8);
                uVar22 = *(ushort *)(lVar64 + 2 + lVar27 * 8);
                local_b70 = (ulong)*(uint *)(lVar64 + 0x88);
                uVar99 = *(uint *)(lVar64 + 4 + lVar27 * 8);
                local_bb0 = local_bc0->scene;
                pGVar59 = (local_bb0->geometries).items[local_b70].ptr;
                local_b78 = *(long *)&pGVar59->field_0x58;
                local_bb8 = (Geometry *)
                            ((ulong)uVar99 *
                            pGVar59[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
                fVar206 = (pGVar59->time_range).lower;
                fVar184 = (((ray->dir).field_0.m128[3] - fVar206) /
                          ((pGVar59->time_range).upper - fVar206)) * pGVar59->fnumTimeSegments;
                auVar104 = roundss(ZEXT416((uint)fVar206),ZEXT416((uint)fVar184),9);
                fVar206 = pGVar59->fnumTimeSegments + -1.0;
                if (fVar206 <= auVar104._0_4_) {
                  auVar104._0_4_ = fVar206;
                }
                fVar206 = 0.0;
                if (0.0 <= auVar104._0_4_) {
                  fVar206 = auVar104._0_4_;
                }
                uVar114 = uVar21 & 0x7fff;
                uVar115 = uVar22 & 0x7fff;
                uVar113 = *(uint *)(local_b78 + 4 + (long)local_bb8);
                uVar70 = (ulong)uVar113;
                uVar57 = (ulong)(uVar113 * uVar115 + *(int *)(local_b78 + (long)local_bb8) + uVar114
                                );
                lVar27 = *(long *)&pGVar59[2].numPrimitives;
                lVar61 = (long)(int)fVar206 * 0x38;
                lVar23 = *(long *)(lVar27 + 0x10 + lVar61);
                lVar24 = *(long *)(lVar27 + lVar61);
                pfVar14 = (float *)(lVar24 + lVar23 * uVar57);
                lVar25 = *(long *)(lVar27 + 0x38 + lVar61);
                lVar61 = *(long *)(lVar27 + 0x48 + lVar61);
                pfVar15 = (float *)(lVar25 + lVar61 * uVar57);
                pfVar16 = (float *)(lVar24 + (uVar57 + 1) * lVar23);
                pfVar17 = (float *)(lVar25 + lVar61 * (uVar57 + 1));
                lVar27 = uVar57 + uVar70;
                pfVar1 = (float *)(lVar24 + lVar27 * lVar23);
                pfVar2 = (float *)(lVar25 + lVar61 * lVar27);
                lVar55 = uVar57 + uVar70 + 1;
                pfVar3 = (float *)(lVar24 + lVar55 * lVar23);
                pfVar4 = (float *)(lVar25 + lVar61 * lVar55);
                uVar69 = (ulong)(-1 < (short)uVar21);
                lVar58 = uVar57 + uVar69 + 1;
                pfVar5 = (float *)(lVar24 + lVar58 * lVar23);
                pfVar6 = (float *)(lVar25 + lVar61 * lVar58);
                lVar58 = uVar69 + lVar55;
                pfVar7 = (float *)(lVar24 + lVar58 * lVar23);
                pfVar8 = (float *)(lVar25 + lVar61 * lVar58);
                uVar57 = 0;
                if (-1 < (short)uVar22) {
                  uVar57 = uVar70;
                }
                pfVar9 = (float *)(lVar24 + (lVar27 + uVar57) * lVar23);
                fVar184 = fVar184 - fVar206;
                pfVar10 = (float *)(lVar25 + lVar61 * (lVar27 + uVar57));
                pfVar11 = (float *)(lVar24 + (lVar55 + uVar57) * lVar23);
                pfVar12 = (float *)(lVar25 + lVar61 * (lVar55 + uVar57));
                fVar244 = (*pfVar17 - *pfVar16) * fVar184 + *pfVar16;
                fVar251 = (pfVar17[1] - pfVar16[1]) * fVar184 + pfVar16[1];
                fVar254 = (pfVar17[2] - pfVar16[2]) * fVar184 + pfVar16[2];
                local_aa8._0_4_ = (*pfVar2 - *pfVar1) * fVar184 + *pfVar1;
                fVar224 = (pfVar2[1] - pfVar1[1]) * fVar184 + pfVar1[1];
                local_b98._0_4_ = (pfVar2[2] - pfVar1[2]) * fVar184 + pfVar1[2];
                local_aa8._4_4_ = (*pfVar4 - *pfVar3) * fVar184 + *pfVar3;
                fVar216 = (pfVar4[1] - pfVar3[1]) * fVar184 + pfVar3[1];
                fVar202 = (pfVar4[2] - pfVar3[2]) * fVar184 + pfVar3[2];
                fVar200 = (*pfVar6 - *pfVar5) * fVar184 + *pfVar5;
                fVar168 = (pfVar6[1] - pfVar5[1]) * fVar184 + pfVar5[1];
                fVar179 = (pfVar6[2] - pfVar5[2]) * fVar184 + pfVar5[2];
                fVar177 = (*pfVar8 - *pfVar7) * fVar184 + *pfVar7;
                fVar238 = (pfVar8[1] - pfVar7[1]) * fVar184 + pfVar7[1];
                fVar240 = (pfVar8[2] - pfVar7[2]) * fVar184 + pfVar7[2];
                fVar181 = (pfVar10[1] - pfVar9[1]) * fVar184 + pfVar9[1];
                fStack_b8c = (pfVar10[2] - pfVar9[2]) * fVar184 + pfVar9[2];
                fVar196 = (*pfVar12 - *pfVar11) * fVar184 + *pfVar11;
                fVar262 = (pfVar12[1] - pfVar11[1]) * fVar184 + pfVar11[1];
                fVar265 = (pfVar12[2] - pfVar11[2]) * fVar184 + pfVar11[2];
                fVar206 = (ray->org).field_0.m128[0];
                fVar208 = (ray->org).field_0.m128[1];
                fVar98 = (ray->org).field_0.m128[2];
                fVar191 = ((*pfVar15 - *pfVar14) * fVar184 + *pfVar14) - fVar206;
                fVar199 = fVar244 - fVar206;
                fVar204 = (float)local_aa8._4_4_ - fVar206;
                fVar209 = (float)local_aa8._0_4_ - fVar206;
                fVar146 = fVar244 - fVar206;
                fVar183 = fVar200 - fVar206;
                fVar180 = fVar177 - fVar206;
                fVar189 = (float)local_aa8._4_4_ - fVar206;
                stack0xfffffffffffff560 = auVar247._8_8_;
                fVar164 = (float)local_aa8._0_4_ - fVar206;
                fVar185 = (float)local_aa8._4_4_ - fVar206;
                fVar97 = fVar196 - fVar206;
                fVar206 = ((*pfVar10 - *pfVar9) * fVar184 + *pfVar9) - fVar206;
                local_b28._0_4_ = ((pfVar15[1] - pfVar14[1]) * fVar184 + pfVar14[1]) - fVar208;
                local_b28._4_4_ = fVar251 - fVar208;
                fStack_b20 = fVar216 - fVar208;
                fStack_b1c = fVar224 - fVar208;
                fVar148 = fVar251 - fVar208;
                fVar169 = fVar168 - fVar208;
                fVar188 = fVar238 - fVar208;
                fVar190 = fVar216 - fVar208;
                fVar100 = fVar224 - fVar208;
                fVar187 = fVar216 - fVar208;
                fVar195 = fVar262 - fVar208;
                fVar208 = fVar181 - fVar208;
                fVar258 = ((pfVar15[2] - pfVar14[2]) * fVar184 + pfVar14[2]) - fVar98;
                fVar263 = fVar254 - fVar98;
                fStack_b10 = fVar202 - fVar98;
                fStack_b0c = (float)local_b98 - fVar98;
                fVar245 = fVar254 - fVar98;
                fVar252 = fVar179 - fVar98;
                fVar255 = fVar240 - fVar98;
                fVar256 = fVar202 - fVar98;
                fVar116 = (float)local_b98 - fVar98;
                fVar176 = fVar202 - fVar98;
                fVar205 = fVar265 - fVar98;
                fVar98 = fStack_b8c - fVar98;
                fVar197 = fVar100 - (float)local_b28._0_4_;
                fVar203 = fVar187 - (float)local_b28._4_4_;
                fVar149 = fVar195 - fStack_b20;
                fVar152 = fVar208 - fStack_b1c;
                local_b38._0_4_ = fVar116 - fVar258;
                local_b38._4_4_ = fVar176 - fVar263;
                fStack_b30 = fVar205 - fStack_b10;
                fStack_b2c = fVar98 - fStack_b0c;
                fVar214 = fVar164 - fVar191;
                fVar217 = fVar185 - fVar199;
                fVar219 = fVar97 - fVar204;
                fVar221 = fVar206 - fVar209;
                fVar155 = (ray->dir).field_0.m128[0];
                fStack_b80 = (ray->dir).field_0.m128[1];
                fStack_b64 = (ray->dir).field_0.m128[2];
                fVar223 = (fVar197 * (fVar116 + fVar258) -
                          (float)local_b38._0_4_ * (fVar100 + (float)local_b28._0_4_)) * fVar155 +
                          ((float)local_b38._0_4_ * (fVar164 + fVar191) -
                          (fVar116 + fVar258) * fVar214) * fStack_b80 +
                          ((fVar100 + (float)local_b28._0_4_) * fVar214 -
                          (fVar164 + fVar191) * fVar197) * fStack_b64;
                fVar225 = (fVar203 * (fVar176 + fVar263) -
                          (float)local_b38._4_4_ * (fVar187 + (float)local_b28._4_4_)) * fVar155 +
                          ((float)local_b38._4_4_ * (fVar185 + fVar199) -
                          (fVar176 + fVar263) * fVar217) * fStack_b80 +
                          ((fVar187 + (float)local_b28._4_4_) * fVar217 -
                          (fVar185 + fVar199) * fVar203) * fStack_b64;
                fVar226 = (fVar149 * (fVar205 + fStack_b10) - fStack_b30 * (fVar195 + fStack_b20)) *
                          fVar155 + (fStack_b30 * (fVar97 + fVar204) -
                                    (fVar205 + fStack_b10) * fVar219) * fStack_b80 +
                                    ((fVar195 + fStack_b20) * fVar219 - (fVar97 + fVar204) * fVar149
                                    ) * fStack_b64;
                fVar227 = (fVar152 * (fVar98 + fStack_b0c) - fStack_b2c * (fVar208 + fStack_b1c)) *
                          fVar155 + (fStack_b2c * (fVar206 + fVar209) -
                                    (fVar98 + fStack_b0c) * fVar221) * fStack_b80 +
                                    ((fVar208 + fStack_b1c) * fVar221 -
                                    (fVar206 + fVar209) * fVar152) * fStack_b64;
                fVar198 = (float)local_b28._0_4_ - fVar148;
                fVar207 = (float)local_b28._4_4_ - fVar169;
                fVar150 = fStack_b20 - fVar188;
                fVar153 = fStack_b1c - fVar190;
                fVar201 = fVar258 - fVar245;
                fVar147 = fVar263 - fVar252;
                fVar151 = fStack_b10 - fVar255;
                fVar154 = fStack_b0c - fVar256;
                fVar234 = fVar191 - fVar146;
                fVar239 = fVar199 - fVar183;
                fVar241 = fVar204 - fVar180;
                fVar242 = fVar209 - fVar189;
                fVar210 = (fVar198 * (fVar258 + fVar245) -
                          fVar201 * ((float)local_b28._0_4_ + fVar148)) * fVar155 +
                          (fVar201 * (fVar191 + fVar146) - (fVar258 + fVar245) * fVar234) *
                          fStack_b80 +
                          (((float)local_b28._0_4_ + fVar148) * fVar234 -
                          (fVar191 + fVar146) * fVar198) * fStack_b64;
                fVar211 = (fVar207 * (fVar263 + fVar252) -
                          fVar147 * ((float)local_b28._4_4_ + fVar169)) * fVar155 +
                          (fVar147 * (fVar199 + fVar183) - (fVar263 + fVar252) * fVar239) *
                          fStack_b80 +
                          (((float)local_b28._4_4_ + fVar169) * fVar239 -
                          (fVar199 + fVar183) * fVar207) * fStack_b64;
                fVar212 = (fVar150 * (fStack_b10 + fVar255) - fVar151 * (fStack_b20 + fVar188)) *
                          fVar155 + (fVar151 * (fVar204 + fVar180) -
                                    (fStack_b10 + fVar255) * fVar241) * fStack_b80 +
                                    ((fStack_b20 + fVar188) * fVar241 -
                                    (fVar204 + fVar180) * fVar150) * fStack_b64;
                fVar213 = (fVar153 * (fStack_b0c + fVar256) - fVar154 * (fStack_b1c + fVar190)) *
                          fVar155 + (fVar154 * (fVar209 + fVar189) -
                                    (fStack_b0c + fVar256) * fVar242) * fStack_b80 +
                                    ((fStack_b1c + fVar190) * fVar242 -
                                    (fVar209 + fVar189) * fVar153) * fStack_b64;
                fVar170 = fVar146 - fVar164;
                fVar178 = fVar183 - fVar185;
                fVar182 = fVar180 - fVar97;
                fVar186 = fVar189 - fVar206;
                fVar215 = fVar148 - fVar100;
                fVar218 = fVar169 - fVar187;
                fVar220 = fVar188 - fVar195;
                fVar222 = fVar190 - fVar208;
                fVar228 = fVar245 - fVar116;
                fVar231 = fVar252 - fVar176;
                fVar232 = fVar255 - fVar205;
                fVar233 = fVar256 - fVar98;
                auVar248._0_4_ =
                     (fVar215 * (fVar116 + fVar245) - fVar228 * (fVar100 + fVar148)) * fVar155 +
                     (fVar228 * (fVar164 + fVar146) - (fVar116 + fVar245) * fVar170) * fStack_b80 +
                     ((fVar100 + fVar148) * fVar170 - (fVar164 + fVar146) * fVar215) * fStack_b64;
                auVar248._4_4_ =
                     (fVar218 * (fVar176 + fVar252) - fVar231 * (fVar187 + fVar169)) * fVar155 +
                     (fVar231 * (fVar185 + fVar183) - (fVar176 + fVar252) * fVar178) * fStack_b80 +
                     ((fVar187 + fVar169) * fVar178 - (fVar185 + fVar183) * fVar218) * fStack_b64;
                auVar248._8_4_ =
                     (fVar220 * (fVar205 + fVar255) - fVar232 * (fVar195 + fVar188)) * fVar155 +
                     (fVar232 * (fVar97 + fVar180) - (fVar205 + fVar255) * fVar182) * fStack_b80 +
                     ((fVar195 + fVar188) * fVar182 - (fVar97 + fVar180) * fVar220) * fStack_b64;
                auVar248._12_4_ =
                     (fVar222 * (fVar98 + fVar256) - fVar233 * (fVar208 + fVar190)) * fVar155 +
                     (fVar233 * (fVar206 + fVar189) - (fVar98 + fVar256) * fVar186) * fStack_b80 +
                     ((fVar208 + fVar190) * fVar186 - (fVar206 + fVar189) * fVar222) * fStack_b64;
                hit.UVW.field_0.v[0] = fVar223 + fVar210 + auVar248._0_4_;
                hit.UVW.field_0.v[1] = fVar225 + fVar211 + auVar248._4_4_;
                fStack_ba0 = fVar226 + fVar212 + auVar248._8_4_;
                fStack_b9c = fVar227 + fVar213 + auVar248._12_4_;
                auVar81._4_4_ = fVar225;
                auVar81._0_4_ = fVar223;
                auVar81._8_4_ = fVar226;
                auVar81._12_4_ = fVar227;
                auVar39._4_4_ = fVar211;
                auVar39._0_4_ = fVar210;
                auVar39._8_4_ = fVar212;
                auVar39._12_4_ = fVar213;
                auVar125 = minps(auVar81,auVar39);
                auVar125 = minps(auVar125,auVar248);
                auVar128._4_4_ = fVar225;
                auVar128._0_4_ = fVar223;
                auVar128._8_4_ = fVar226;
                auVar128._12_4_ = fVar227;
                auVar40._4_4_ = fVar211;
                auVar40._0_4_ = fVar210;
                auVar40._8_4_ = fVar212;
                auVar40._12_4_ = fVar213;
                auVar134 = maxps(auVar128,auVar40);
                auVar134 = maxps(auVar134,auVar248);
                fVar206 = ABS(hit.UVW.field_0.v[0]) * 1.1920929e-07;
                fVar208 = ABS(hit.UVW.field_0.v[1]) * 1.1920929e-07;
                fVar98 = ABS(fStack_ba0) * 1.1920929e-07;
                fVar164 = ABS(fStack_b9c) * 1.1920929e-07;
                puVar13 = (undefined8 *)(lVar24 + lVar23 * (uVar57 + lVar58));
                uVar48 = *puVar13;
                uVar49 = puVar13[1];
                puVar13 = (undefined8 *)(lVar25 + (uVar57 + lVar58) * lVar61);
                uVar50 = *puVar13;
                uVar51 = puVar13[1];
                local_8a8 = auVar53._0_4_;
                uStack_8a4 = auVar53._4_4_;
                uStack_8a0 = auVar53._8_4_;
                uStack_89c = auVar53._12_4_;
                auVar129._0_4_ =
                     -(uint)(auVar134._0_4_ <= fVar206 || -fVar206 <= auVar125._0_4_) & local_8a8;
                auVar129._4_4_ =
                     -(uint)(auVar134._4_4_ <= fVar208 || -fVar208 <= auVar125._4_4_) & uStack_8a4;
                auVar129._8_4_ =
                     -(uint)(auVar134._8_4_ <= fVar98 || -fVar98 <= auVar125._8_4_) & uStack_8a0;
                auVar129._12_4_ =
                     -(uint)(auVar134._12_4_ <= fVar164 || -fVar164 <= auVar125._12_4_) & uStack_89c
                ;
                uVar113 = movmskps((int)&mapUV,auVar129);
                p_Var56 = (RTCFilterFunctionN)(ulong)uVar113;
                local_b48 = ZEXT416(uVar114);
                local_b58 = ZEXT416(uVar115);
                pNVar68 = local_bc8;
                uVar57 = local_bd0;
                uVar69 = local_bd8;
                fStack_b90 = fVar265;
                local_b98._4_4_ = fVar202;
                if (uVar113 != 0) {
                  auVar229._0_4_ = fVar197 * fVar201 - (float)local_b38._0_4_ * fVar198;
                  auVar229._4_4_ = fVar203 * fVar147 - (float)local_b38._4_4_ * fVar207;
                  auVar229._8_4_ = fVar149 * fVar151 - fStack_b30 * fVar150;
                  auVar229._12_4_ = fVar152 * fVar154 - fStack_b2c * fVar153;
                  auVar142._0_4_ = fVar198 * fVar228 - fVar201 * fVar215;
                  auVar142._4_4_ = fVar207 * fVar231 - fVar147 * fVar218;
                  auVar142._8_4_ = fVar150 * fVar232 - fVar151 * fVar220;
                  auVar142._12_4_ = fVar153 * fVar233 - fVar154 * fVar222;
                  auVar82._4_4_ =
                       -(uint)(ABS((float)local_b38._4_4_ * fVar207) < ABS(fVar147 * fVar218));
                  auVar82._0_4_ =
                       -(uint)(ABS((float)local_b38._0_4_ * fVar198) < ABS(fVar201 * fVar215));
                  auVar82._8_4_ = -(uint)(ABS(fStack_b30 * fVar150) < ABS(fVar151 * fVar220));
                  auVar82._12_4_ = -(uint)(ABS(fStack_b2c * fVar153) < ABS(fVar154 * fVar222));
                  hit.vNg.field_0.field_0.x.field_0 =
                       (vfloat_impl<4>)blendvps(auVar142,auVar229,auVar82);
                  auVar259._0_4_ = (float)local_b38._0_4_ * fVar234 - fVar214 * fVar201;
                  auVar259._4_4_ = (float)local_b38._4_4_ * fVar239 - fVar217 * fVar147;
                  auVar259._8_4_ = fStack_b30 * fVar241 - fVar219 * fVar151;
                  auVar259._12_4_ = fStack_b2c * fVar242 - fVar221 * fVar154;
                  auVar159._0_4_ = fVar201 * fVar170 - fVar234 * fVar228;
                  auVar159._4_4_ = fVar147 * fVar178 - fVar239 * fVar231;
                  auVar159._8_4_ = fVar151 * fVar182 - fVar241 * fVar232;
                  auVar159._12_4_ = fVar154 * fVar186 - fVar242 * fVar233;
                  auVar83._4_4_ = -(uint)(ABS(fVar217 * fVar147) < ABS(fVar239 * fVar231));
                  auVar83._0_4_ = -(uint)(ABS(fVar214 * fVar201) < ABS(fVar234 * fVar228));
                  auVar83._8_4_ = -(uint)(ABS(fVar219 * fVar151) < ABS(fVar241 * fVar232));
                  auVar83._12_4_ = -(uint)(ABS(fVar221 * fVar154) < ABS(fVar242 * fVar233));
                  hit.vNg.field_0.field_0.y.field_0 =
                       (vfloat_impl<4>)blendvps(auVar159,auVar259,auVar83);
                  auVar236._0_4_ = fVar234 * fVar215 - fVar198 * fVar170;
                  auVar236._4_4_ = fVar239 * fVar218 - fVar207 * fVar178;
                  auVar236._8_4_ = fVar241 * fVar220 - fVar150 * fVar182;
                  auVar236._12_4_ = fVar242 * fVar222 - fVar153 * fVar186;
                  auVar84._4_4_ = -(uint)(ABS(fVar203 * fVar239) < ABS(fVar207 * fVar178));
                  auVar84._0_4_ = -(uint)(ABS(fVar197 * fVar234) < ABS(fVar198 * fVar170));
                  auVar84._8_4_ = -(uint)(ABS(fVar149 * fVar241) < ABS(fVar150 * fVar182));
                  auVar84._12_4_ = -(uint)(ABS(fVar152 * fVar242) < ABS(fVar153 * fVar186));
                  auVar42._4_4_ = fVar217 * fVar207 - fVar203 * fVar239;
                  auVar42._0_4_ = fVar214 * fVar198 - fVar197 * fVar234;
                  auVar42._8_4_ = fVar219 * fVar150 - fVar149 * fVar241;
                  auVar42._12_4_ = fVar221 * fVar153 - fVar152 * fVar242;
                  hit.vNg.field_0.field_0.z.field_0 =
                       (vfloat_impl<4>)blendvps(auVar236,auVar42,auVar84);
                  fVar187 = hit.vNg.field_0._4_4_;
                  fVar195 = hit.vNg.field_0._8_4_;
                  fVar116 = hit.vNg.field_0._12_4_;
                  fVar206 = fVar155 * hit.vNg.field_0._0_4_ +
                            fStack_b80 * hit.vNg.field_0._16_4_ +
                            fStack_b64 * hit.vNg.field_0._32_4_;
                  fVar208 = fVar155 * fVar187 +
                            fStack_b80 * hit.vNg.field_0._20_4_ +
                            fStack_b64 * hit.vNg.field_0._36_4_;
                  fVar98 = fVar155 * fVar195 +
                           fStack_b80 * hit.vNg.field_0._24_4_ + fStack_b64 * hit.vNg.field_0._40_4_
                  ;
                  fVar155 = fVar155 * fVar116 +
                            fStack_b80 * hit.vNg.field_0._28_4_ +
                            fStack_b64 * hit.vNg.field_0._44_4_;
                  auVar193._0_4_ = fVar206 + fVar206;
                  auVar193._4_4_ = fVar208 + fVar208;
                  auVar193._8_4_ = fVar98 + fVar98;
                  auVar193._12_4_ = fVar155 + fVar155;
                  auVar105._0_4_ =
                       (float)local_b28._0_4_ * hit.vNg.field_0._16_4_ +
                       fVar258 * hit.vNg.field_0._32_4_;
                  auVar105._4_4_ =
                       (float)local_b28._4_4_ * hit.vNg.field_0._20_4_ +
                       fVar263 * hit.vNg.field_0._36_4_;
                  auVar105._8_4_ =
                       fStack_b20 * hit.vNg.field_0._24_4_ + fStack_b10 * hit.vNg.field_0._40_4_;
                  auVar105._12_4_ =
                       fStack_b1c * hit.vNg.field_0._28_4_ + fStack_b0c * hit.vNg.field_0._44_4_;
                  fVar164 = fVar191 * hit.vNg.field_0._0_4_ + auVar105._0_4_;
                  fVar185 = fVar199 * fVar187 + auVar105._4_4_;
                  fVar97 = fVar204 * fVar195 + auVar105._8_4_;
                  fVar100 = fVar209 * fVar116 + auVar105._12_4_;
                  auVar125 = rcpps(auVar105,auVar193);
                  fVar206 = auVar125._0_4_;
                  fVar208 = auVar125._4_4_;
                  fVar98 = auVar125._8_4_;
                  fVar155 = auVar125._12_4_;
                  hit.vt.field_0.v[0] =
                       ((1.0 - auVar193._0_4_ * fVar206) * fVar206 + fVar206) * (fVar164 + fVar164);
                  hit.vt.field_0.v[1] =
                       ((1.0 - auVar193._4_4_ * fVar208) * fVar208 + fVar208) * (fVar185 + fVar185);
                  hit.vt.field_0.v[2] =
                       ((1.0 - auVar193._8_4_ * fVar98) * fVar98 + fVar98) * (fVar97 + fVar97);
                  hit.vt.field_0.v[3] =
                       ((1.0 - auVar193._12_4_ * fVar155) * fVar155 + fVar155) * (fVar100 + fVar100)
                  ;
                  fVar206 = ray->tfar;
                  fVar208 = (ray->org).field_0.m128[3];
                  iVar75 = -(uint)(fVar208 <= hit.vt.field_0.v[1]);
                  iVar76 = -(uint)(fVar208 <= hit.vt.field_0.v[2]);
                  iVar77 = -(uint)(fVar208 <= hit.vt.field_0.v[3]);
                  auVar106._8_4_ = iVar76;
                  auVar106._4_4_ = iVar75;
                  auVar106._12_4_ = iVar77;
                  auVar194._0_4_ =
                       (int)((uint)((hit.vt.field_0.v[0] <= fVar206 &&
                                    fVar208 <= hit.vt.field_0.v[0]) && auVar193._0_4_ != 0.0) *
                            -0x80000000) >> 0x1f;
                  auVar194._4_4_ =
                       (int)((uint)((hit.vt.field_0.v[1] <= fVar206 &&
                                    fVar208 <= hit.vt.field_0.v[1]) && auVar193._4_4_ != 0.0) *
                            -0x80000000) >> 0x1f;
                  auVar194._8_4_ =
                       (int)((uint)((hit.vt.field_0.v[2] <= fVar206 &&
                                    fVar208 <= hit.vt.field_0.v[2]) && auVar193._8_4_ != 0.0) *
                            -0x80000000) >> 0x1f;
                  auVar194._12_4_ =
                       (int)((uint)((hit.vt.field_0.v[3] <= fVar206 &&
                                    fVar208 <= hit.vt.field_0.v[3]) && auVar193._12_4_ != 0.0) *
                            -0x80000000) >> 0x1f;
                  hit.valid.field_0 =
                       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar194 & auVar129);
                  uVar113 = movmskps(uVar113,(undefined1  [16])hit.valid.field_0);
                  p_Var56 = (RTCFilterFunctionN)(ulong)uVar113;
                  if (uVar113 != 0) {
                    hit.mapUV = &mapUV;
                    auVar106._0_4_ = (float)(int)(*(ushort *)(local_b78 + 8 + (long)local_bb8) - 1);
                    auVar136._4_4_ = iVar75;
                    auVar136._0_4_ = auVar106._0_4_;
                    auVar136._8_4_ = iVar76;
                    auVar136._12_4_ = iVar77;
                    auVar125 = rcpss(auVar136,auVar106);
                    auVar143._4_12_ = hit.vNg.field_0._4_12_;
                    auVar143._0_4_ = (float)(int)(*(ushort *)(local_b78 + 10 + (long)local_bb8) - 1)
                    ;
                    fVar206 = (2.0 - auVar106._0_4_ * auVar125._0_4_) * auVar125._0_4_;
                    auVar137._4_4_ = fVar187;
                    auVar137._0_4_ = auVar143._0_4_;
                    auVar137._8_4_ = fVar195;
                    auVar137._12_4_ = fVar116;
                    auVar125 = rcpss(auVar137,auVar143);
                    fVar208 = (2.0 - auVar143._0_4_ * auVar125._0_4_) * auVar125._0_4_;
                    hit.U.field_0._0_4_ =
                         fVar206 * ((float)uVar114 * hit.UVW.field_0.v[0] + fVar223);
                    hit.U.field_0._4_4_ =
                         fVar206 * ((float)(uVar114 + 1) * hit.UVW.field_0.v[1] + fVar225);
                    hit.U.field_0._8_4_ = fVar206 * ((float)(uVar114 + 1) * fStack_ba0 + fVar226);
                    hit.U.field_0._12_4_ = fVar206 * ((float)uVar114 * fStack_b9c + fVar227);
                    auVar119._0_4_ = (float)uVar115 * hit.UVW.field_0.v[0] + fVar210;
                    auVar119._4_4_ = (float)uVar115 * hit.UVW.field_0.v[1] + fVar211;
                    auVar119._8_4_ = (float)(uVar115 + 1) * fStack_ba0 + fVar212;
                    auVar119._12_4_ = (float)(uVar115 + 1) * fStack_b9c + fVar213;
                    hit.V.field_0._0_4_ = fVar208 * auVar119._0_4_;
                    hit.V.field_0._4_4_ = fVar208 * auVar119._4_4_;
                    hit.V.field_0._8_4_ = fVar208 * auVar119._8_4_;
                    hit.V.field_0._12_4_ = fVar208 * auVar119._12_4_;
                    pGVar59 = (local_bb0->geometries).items[local_b70].ptr;
                    p_Var56 = (RTCFilterFunctionN)(ulong)(uint)ray->mask;
                    if ((pGVar59->mask & ray->mask) != 0) {
                      auVar65 = (undefined1  [8])local_bc0->args;
                      if ((((RTCIntersectArguments *)auVar65)->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar59->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00238f69;
                      auVar52._4_4_ = hit.UVW.field_0.i[1];
                      auVar52._0_4_ = hit.UVW.field_0.i[0];
                      auVar52._8_4_ = fStack_ba0;
                      auVar52._12_4_ = fStack_b9c;
                      auVar125 = rcpps(auVar119,auVar52);
                      fVar206 = auVar125._0_4_;
                      fVar208 = auVar125._4_4_;
                      fVar98 = auVar125._8_4_;
                      fVar155 = auVar125._12_4_;
                      fVar206 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[0])) &
                                       (uint)(((float)DAT_01feca10 - hit.UVW.field_0.v[0] * fVar206)
                                              * fVar206 + fVar206));
                      fVar208 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[1])) &
                                       (uint)((DAT_01feca10._4_4_ - hit.UVW.field_0.v[1] * fVar208)
                                              * fVar208 + fVar208));
                      fVar98 = (float)(-(uint)(1e-18 <= ABS(fStack_ba0)) &
                                      (uint)((DAT_01feca10._8_4_ - fStack_ba0 * fVar98) * fVar98 +
                                            fVar98));
                      fVar155 = (float)(-(uint)(1e-18 <= ABS(fStack_b9c)) &
                                       (uint)((DAT_01feca10._12_4_ - fStack_b9c * fVar155) * fVar155
                                             + fVar155));
                      auVar85._0_4_ = hit.U.field_0._0_4_ * fVar206;
                      auVar85._4_4_ = hit.U.field_0._4_4_ * fVar208;
                      auVar85._8_4_ = hit.U.field_0._8_4_ * fVar98;
                      auVar85._12_4_ = hit.U.field_0._12_4_ * fVar155;
                      hit.vu.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar85,_DAT_01feca10);
                      auVar107._0_4_ = hit.V.field_0._0_4_ * fVar206;
                      auVar107._4_4_ = hit.V.field_0._4_4_ * fVar208;
                      auVar107._8_4_ = hit.V.field_0._8_4_ * fVar98;
                      auVar107._12_4_ = hit.V.field_0._12_4_ * fVar155;
                      hit.vv.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar107,_DAT_01feca10);
                      iVar75 = movmskps((int)local_bc0,(undefined1  [16])hit.valid.field_0);
                      p_Var56 = (RTCFilterFunctionN)CONCAT44((int)((ulong)local_bc0 >> 0x20),iVar75)
                      ;
                      local_b88 = (RTCFilterFunctionN)0x0;
                      if (p_Var56 != (RTCFilterFunctionN)0x0) {
                        for (; ((ulong)p_Var56 >> (long)local_b88 & 1) == 0;
                            local_b88 = local_b88 + 1) {
                        }
                      }
                      local_b38[0] = iVar75 == 0;
                      if (iVar75 != 0) {
                        local_ba8 = SUB84(local_bc0->user,0);
                        fStack_ba4 = (float)((ulong)local_bc0->user >> 0x20);
                        local_b28 = auVar65;
                        local_bf8 = p_Var56;
                        fStack_b7c = fStack_b80;
                        fStack_b60 = fStack_b64;
                        fStack_b5c = fStack_b64;
                        local_b18 = pGVar59;
                        hit.UVW.field_0.v[2] = fStack_ba0;
                        hit.UVW.field_0.v[3] = fStack_b9c;
                        do {
                          h.u = hit.vu.field_0.v[(long)local_b88];
                          h.v = hit.vv.field_0.v[(long)local_b88];
                          local_b68 = ray->tfar;
                          ray->tfar = hit.vt.field_0.v[(long)local_b88];
                          h.Ng.field_0.field_0.x =
                               *(float *)((long)&hit.vNg.field_0 + (long)local_b88 * 4);
                          h.Ng.field_0.field_0.y =
                               *(float *)((long)&hit.vNg.field_0 + (long)local_b88 * 4 + 0x10);
                          h.Ng.field_0.field_0.z =
                               *(float *)((long)&hit.vNg.field_0 + (long)local_b88 * 4 + 0x20);
                          h.geomID = (uint)local_b70;
                          h.instID[0] = *(uint *)CONCAT44(fStack_ba4,local_ba8);
                          h.instPrimID[0] = *(uint *)(CONCAT44(fStack_ba4,local_ba8) + 4);
                          local_bdc = -1;
                          args.valid = &local_bdc;
                          args.geometryUserPtr = pGVar59->userPtr;
                          args.context = (RTCRayQueryContext *)CONCAT44(fStack_ba4,local_ba8);
                          args.hit = (RTCHitN *)&h;
                          args.N = 1;
                          h.primID = uVar99;
                          args.ray = (RTCRayN *)ray;
                          if (pGVar59->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00238583:
                            p_Var56 = ((RTCIntersectArguments *)auVar65)->filter;
                            if (p_Var56 != (RTCFilterFunctionN)0x0) {
                              if (((((RTCIntersectArguments *)auVar65)->flags &
                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar59->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var56)(&args);
                                pGVar59 = local_b18;
                                auVar65 = local_b28;
                                pNVar68 = local_bc8;
                                uVar57 = local_bd0;
                                uVar69 = local_bd8;
                              }
                              p_Var56 = (RTCFilterFunctionN)args.valid;
                              if (*args.valid == 0) goto LAB_002385da;
                            }
                            if ((_local_b38 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            goto LAB_00238f69;
                            break;
                          }
                          (*pGVar59->occlusionFilterN)(&args);
                          pGVar59 = local_b18;
                          auVar65 = local_b28;
                          pNVar68 = local_bc8;
                          uVar57 = local_bd0;
                          uVar69 = local_bd8;
                          if (*args.valid != 0) goto LAB_00238583;
LAB_002385da:
                          ray->tfar = local_b68;
                          local_bf8 = (RTCFilterFunctionN)
                                      ((ulong)local_bf8 ^ 1L << ((ulong)local_b88 & 0x3f));
                          p_Var56 = (RTCFilterFunctionN)0x0;
                          if (local_bf8 != (RTCFilterFunctionN)0x0) {
                            for (; ((ulong)local_bf8 >> (long)p_Var56 & 1) == 0;
                                p_Var56 = p_Var56 + 1) {
                            }
                          }
                          local_b38[0] = local_bf8 == (RTCFilterFunctionN)0x0;
                          local_b88 = p_Var56;
                        } while (local_bf8 != (RTCFilterFunctionN)0x0);
                      }
                    }
                  }
                }
                local_878 = (float)uVar48;
                fStack_874 = (float)((ulong)uVar48 >> 0x20);
                fStack_870 = (float)uVar49;
                local_888 = (float)uVar50;
                fStack_884 = (float)((ulong)uVar50 >> 0x20);
                fStack_880 = (float)uVar51;
                fVar206 = (ray->org).field_0.m128[0];
                fVar208 = (ray->org).field_0.m128[1];
                fVar98 = (ray->org).field_0.m128[2];
                fVar185 = (float)local_aa8._4_4_ - fVar206;
                fVar177 = fVar177 - fVar206;
                fVar97 = (fVar184 * (local_888 - local_878) + local_878) - fVar206;
                fVar196 = fVar196 - fVar206;
                local_ba8 = fVar216 - fVar208;
                fStack_ba4 = fVar238 - fVar208;
                fStack_ba0 = (fVar184 * (fStack_884 - fStack_874) + fStack_874) - fVar208;
                fStack_b9c = fVar262 - fVar208;
                fVar202 = fVar202 - fVar98;
                fVar240 = fVar240 - fVar98;
                fVar188 = (fVar184 * (fStack_880 - fStack_870) + fStack_870) - fVar98;
                fVar265 = fVar265 - fVar98;
                local_aa8._8_4_ = auVar247._8_4_;
                fStack_a9c = auVar247._12_4_;
                fVar155 = (float)local_aa8._0_4_ - fVar206;
                fVar164 = (float)local_aa8._4_4_ - fVar206;
                fVar176 = (float)local_aa8._8_4_ - fVar206;
                fVar183 = fStack_a9c - fVar206;
                fVar224 = fVar224 - fVar208;
                fVar209 = fVar216 - fVar208;
                fVar262 = fVar262 - fVar208;
                fVar181 = fVar181 - fVar208;
                local_b98._0_4_ = (float)local_b98 - fVar98;
                local_b98._4_4_ = local_b98._4_4_ - fVar98;
                fVar205 = fStack_b90 - fVar98;
                fStack_b8c = fStack_b8c - fVar98;
                fVar244 = fVar244 - fVar206;
                fVar200 = fVar200 - fVar206;
                fVar178 = fStack_840 - fVar206;
                fVar206 = fStack_83c - fVar206;
                fVar251 = fVar251 - fVar208;
                fVar168 = fVar168 - fVar208;
                fVar238 = fVar238 - fVar208;
                fVar216 = fVar216 - fVar208;
                fVar254 = fVar254 - fVar98;
                fVar179 = fVar179 - fVar98;
                fVar197 = fStack_810 - fVar98;
                fVar98 = fStack_80c - fVar98;
                fVar189 = fVar244 - fVar185;
                fVar190 = fVar200 - fVar177;
                fStack_b80 = fVar178 - fVar97;
                fStack_b7c = fVar206 - fVar196;
                fVar213 = fVar251 - local_ba8;
                fVar214 = fVar168 - fStack_ba4;
                fStack_b10 = fVar238 - fStack_ba0;
                fStack_b0c = fVar216 - fStack_b9c;
                local_b68 = fVar254 - fVar202;
                fStack_b64 = fVar179 - fVar240;
                fStack_b60 = fVar197 - fVar188;
                fStack_b5c = fVar98 - fVar265;
                fVar184 = (ray->dir).field_0.m128[0];
                fVar208 = (ray->dir).field_0.m128[1];
                fStack_b90 = (ray->dir).field_0.m128[2];
                local_b18 = (Geometry *)CONCAT44(fVar214,fVar213);
                local_b88 = (RTCFilterFunctionN)CONCAT44(fVar190,fVar189);
                fVar147 = (fVar213 * (fVar254 + fVar202) - local_b68 * (fVar251 + local_ba8)) *
                          fVar184 + (local_b68 * (fVar244 + fVar185) - (fVar254 + fVar202) * fVar189
                                    ) * fVar208 +
                                    ((fVar251 + local_ba8) * fVar189 - (fVar244 + fVar185) * fVar213
                                    ) * fStack_b90;
                fVar150 = (fVar214 * (fVar179 + fVar240) - fStack_b64 * (fVar168 + fStack_ba4)) *
                          fVar184 + (fStack_b64 * (fVar200 + fVar177) -
                                    (fVar179 + fVar240) * fVar190) * fVar208 +
                                    ((fVar168 + fStack_ba4) * fVar190 -
                                    (fVar200 + fVar177) * fVar214) * fStack_b90;
                fVar152 = (fStack_b10 * (fVar197 + fVar188) - fStack_b60 * (fVar238 + fStack_ba0)) *
                          fVar184 + (fStack_b60 * (fVar178 + fVar97) -
                                    (fVar197 + fVar188) * fStack_b80) * fVar208 +
                                    ((fVar238 + fStack_ba0) * fStack_b80 -
                                    (fVar178 + fVar97) * fStack_b10) * fStack_b90;
                fVar154 = (fStack_b0c * (fVar98 + fVar265) - fStack_b5c * (fVar216 + fStack_b9c)) *
                          fVar184 + (fStack_b5c * (fVar206 + fVar196) -
                                    (fVar98 + fVar265) * fStack_b7c) * fVar208 +
                                    ((fVar216 + fStack_b9c) * fStack_b7c -
                                    (fVar206 + fVar196) * fStack_b0c) * fStack_b90;
                fVar198 = local_ba8 - fVar224;
                fVar201 = fStack_ba4 - fVar209;
                fVar203 = fStack_ba0 - fVar262;
                fVar207 = fStack_b9c - fVar181;
                fVar204 = fVar202 - (float)local_b98;
                fVar210 = fVar240 - local_b98._4_4_;
                fVar211 = fVar188 - fVar205;
                fVar212 = fVar265 - fStack_b8c;
                fVar182 = fVar185 - fVar155;
                fVar186 = fVar177 - fVar164;
                fVar191 = fVar97 - fVar176;
                fVar199 = fVar196 - fVar183;
                fVar100 = (fVar198 * (fVar202 + (float)local_b98) - fVar204 * (local_ba8 + fVar224))
                          * fVar184 +
                          (fVar204 * (fVar185 + fVar155) - (fVar202 + (float)local_b98) * fVar182) *
                          fVar208 + ((local_ba8 + fVar224) * fVar182 - (fVar185 + fVar155) * fVar198
                                    ) * fStack_b90;
                fVar195 = (fVar201 * (fVar240 + local_b98._4_4_) - fVar210 * (fStack_ba4 + fVar209))
                          * fVar184 +
                          (fVar210 * (fVar177 + fVar164) - (fVar240 + local_b98._4_4_) * fVar186) *
                          fVar208 + ((fStack_ba4 + fVar209) * fVar186 -
                                    (fVar177 + fVar164) * fVar201) * fStack_b90;
                local_b28._4_4_ = fVar195;
                local_b28._0_4_ = fVar100;
                fVar146 = (fVar203 * (fVar188 + fVar205) - fVar211 * (fStack_ba0 + fVar262)) *
                          fVar184 + (fVar211 * (fVar97 + fVar176) - (fVar188 + fVar205) * fVar191) *
                                    fVar208 + ((fStack_ba0 + fVar262) * fVar191 -
                                              (fVar97 + fVar176) * fVar203) * fStack_b90;
                fVar169 = (fVar207 * (fVar265 + fStack_b8c) - fVar212 * (fStack_b9c + fVar181)) *
                          fVar184 + (fVar212 * (fVar196 + fVar183) -
                                    (fVar265 + fStack_b8c) * fVar199) * fVar208 +
                                    ((fStack_b9c + fVar181) * fVar199 -
                                    (fVar196 + fVar183) * fVar207) * fStack_b90;
                local_aa8._0_4_ = fVar155 - fVar244;
                local_aa8._4_4_ = fVar164 - fVar200;
                local_aa8._8_4_ = fVar176 - fVar178;
                fStack_a9c = fVar183 - fVar206;
                fStack_b20 = fVar146;
                fStack_b1c = fVar169;
                local_b38 = (undefined1  [8])CONCAT44(fVar150,fVar147);
                fStack_b30 = fVar152;
                fStack_b2c = fVar154;
                fVar187 = fVar224 - fVar251;
                fVar116 = fVar209 - fVar168;
                fVar148 = fVar262 - fVar238;
                fVar180 = fVar181 - fVar216;
                fVar149 = (float)local_b98 - fVar254;
                fVar151 = local_b98._4_4_ - fVar179;
                fVar153 = fVar205 - fVar197;
                fVar170 = fStack_b8c - fVar98;
                auVar86._0_4_ =
                     (fVar187 * (fVar254 + (float)local_b98) - fVar149 * (fVar251 + fVar224)) *
                     fVar184 + (fVar149 * (fVar244 + fVar155) -
                               (fVar254 + (float)local_b98) * (float)local_aa8._0_4_) * fVar208 +
                               ((fVar251 + fVar224) * (float)local_aa8._0_4_ -
                               (fVar244 + fVar155) * fVar187) * fStack_b90;
                auVar86._4_4_ =
                     (fVar116 * (fVar179 + local_b98._4_4_) - fVar151 * (fVar168 + fVar209)) *
                     fVar184 + (fVar151 * (fVar200 + fVar164) -
                               (fVar179 + local_b98._4_4_) * (float)local_aa8._4_4_) * fVar208 +
                               ((fVar168 + fVar209) * (float)local_aa8._4_4_ -
                               (fVar200 + fVar164) * fVar116) * fStack_b90;
                auVar86._8_4_ =
                     (fVar148 * (fVar197 + fVar205) - fVar153 * (fVar238 + fVar262)) * fVar184 +
                     (fVar153 * (fVar178 + fVar176) - (fVar197 + fVar205) * (float)local_aa8._8_4_)
                     * fVar208 +
                     ((fVar238 + fVar262) * (float)local_aa8._8_4_ - (fVar178 + fVar176) * fVar148)
                     * fStack_b90;
                auVar86._12_4_ =
                     (fVar180 * (fVar98 + fStack_b8c) - fVar170 * (fVar216 + fVar181)) * fVar184 +
                     (fVar170 * (fVar206 + fVar183) - (fVar98 + fStack_b8c) * fStack_a9c) * fVar208
                     + ((fVar216 + fVar181) * fStack_a9c - (fVar206 + fVar183) * fVar180) *
                       fStack_b90;
                hit.UVW.field_0.v[0] = fVar147 + fVar100 + auVar86._0_4_;
                hit.UVW.field_0.v[1] = fVar150 + fVar195 + auVar86._4_4_;
                hit.UVW.field_0.v[2] = fVar152 + fVar146 + auVar86._8_4_;
                hit.UVW.field_0.v[3] = fVar154 + fVar169 + auVar86._12_4_;
                auVar108._8_4_ = fVar152;
                auVar108._0_8_ = local_b38;
                auVar108._12_4_ = fVar154;
                auVar247 = minps(auVar108,_local_b28);
                auVar247 = minps(auVar247,auVar86);
                auVar125 = maxps(_local_b38,_local_b28);
                auVar125 = maxps(auVar125,auVar86);
                fVar206 = ABS(hit.UVW.field_0.v[0]) * 1.1920929e-07;
                fVar98 = ABS(hit.UVW.field_0.v[1]) * 1.1920929e-07;
                fVar155 = ABS(hit.UVW.field_0.v[2]) * 1.1920929e-07;
                fVar164 = ABS(hit.UVW.field_0.v[3]) * 1.1920929e-07;
                auVar144._4_4_ = -(uint)(auVar125._4_4_ <= fVar98);
                auVar144._0_4_ = -(uint)(auVar125._0_4_ <= fVar206);
                auVar144._8_4_ = -(uint)(auVar125._8_4_ <= fVar155);
                auVar144._12_4_ = -(uint)(auVar125._12_4_ <= fVar164);
                auVar109._4_4_ = -(uint)(-fVar98 <= auVar247._4_4_);
                auVar109._0_4_ = -(uint)(-fVar206 <= auVar247._0_4_);
                auVar109._8_4_ = -(uint)(-fVar155 <= auVar247._8_4_);
                auVar109._12_4_ = -(uint)(-fVar164 <= auVar247._12_4_);
                auVar144 = auVar144 | auVar109;
                auVar145._0_4_ = auVar144._0_4_ & local_8a8;
                auVar145._4_4_ = auVar144._4_4_ & uStack_8a4;
                auVar145._8_4_ = auVar144._8_4_ & uStack_8a0;
                auVar145._12_4_ = auVar144._12_4_ & uStack_89c;
                iVar75 = movmskps((int)p_Var56,auVar145);
                if (iVar75 != 0) {
                  auVar138._0_4_ = fVar213 * fVar204 - local_b68 * fVar198;
                  auVar138._4_4_ = fVar214 * fVar210 - fStack_b64 * fVar201;
                  auVar138._8_4_ = fStack_b10 * fVar211 - fStack_b60 * fVar203;
                  auVar138._12_4_ = fStack_b0c * fVar212 - fStack_b5c * fVar207;
                  auVar230._0_4_ = fVar198 * fVar149 - fVar204 * fVar187;
                  auVar230._4_4_ = fVar201 * fVar151 - fVar210 * fVar116;
                  auVar230._8_4_ = fVar203 * fVar153 - fVar211 * fVar148;
                  auVar230._12_4_ = fVar207 * fVar170 - fVar212 * fVar180;
                  uVar113 = (uint)DAT_01fec6c0;
                  uVar114 = DAT_01fec6c0._4_4_;
                  uVar115 = DAT_01fec6c0._8_4_;
                  uVar117 = DAT_01fec6c0._12_4_;
                  auVar87._4_4_ =
                       -(uint)((float)((uint)(fStack_b64 * fVar201) & uVar114) <
                              (float)((uint)(fVar210 * fVar116) & uVar114));
                  auVar87._0_4_ =
                       -(uint)((float)((uint)(local_b68 * fVar198) & uVar113) <
                              (float)((uint)(fVar204 * fVar187) & uVar113));
                  auVar87._8_4_ =
                       -(uint)((float)((uint)(fStack_b60 * fVar203) & uVar115) <
                              (float)((uint)(fVar211 * fVar148) & uVar115));
                  auVar87._12_4_ =
                       -(uint)((float)((uint)(fStack_b5c * fVar207) & uVar117) <
                              (float)((uint)(fVar212 * fVar180) & uVar117));
                  hit.vNg.field_0.field_0.x.field_0 =
                       (vfloat_impl<4>)blendvps(auVar230,auVar138,auVar87);
                  auVar260._0_4_ = fVar204 * (float)local_aa8._0_4_ - fVar182 * fVar149;
                  auVar260._4_4_ = fVar210 * (float)local_aa8._4_4_ - fVar186 * fVar151;
                  auVar260._8_4_ = fVar211 * (float)local_aa8._8_4_ - fVar191 * fVar153;
                  auVar260._12_4_ = fVar212 * fStack_a9c - fVar199 * fVar170;
                  auVar88._4_4_ =
                       -(uint)((float)((uint)(fVar190 * fVar210) & uVar114) <
                              (float)((uint)(fVar186 * fVar151) & uVar114));
                  auVar88._0_4_ =
                       -(uint)((float)((uint)(fVar189 * fVar204) & uVar113) <
                              (float)((uint)(fVar182 * fVar149) & uVar113));
                  auVar88._8_4_ =
                       -(uint)((float)((uint)(fStack_b80 * fVar211) & uVar115) <
                              (float)((uint)(fVar191 * fVar153) & uVar115));
                  auVar88._12_4_ =
                       -(uint)((float)((uint)(fStack_b7c * fVar212) & uVar117) <
                              (float)((uint)(fVar199 * fVar170) & uVar117));
                  auVar41._4_4_ = fStack_b64 * fVar186 - fVar190 * fVar210;
                  auVar41._0_4_ = local_b68 * fVar182 - fVar189 * fVar204;
                  auVar41._8_4_ = fStack_b60 * fVar191 - fStack_b80 * fVar211;
                  auVar41._12_4_ = fStack_b5c * fVar199 - fStack_b7c * fVar212;
                  hit.vNg.field_0.field_0.y.field_0 =
                       (vfloat_impl<4>)blendvps(auVar260,auVar41,auVar88);
                  auVar249._0_4_ = fVar189 * fVar198 - fVar213 * fVar182;
                  auVar249._4_4_ = fVar190 * fVar201 - fVar214 * fVar186;
                  auVar249._8_4_ = fStack_b80 * fVar203 - fStack_b10 * fVar191;
                  auVar249._12_4_ = fStack_b7c * fVar207 - fStack_b0c * fVar199;
                  auVar237._0_4_ = fVar182 * fVar187 - fVar198 * (float)local_aa8._0_4_;
                  auVar237._4_4_ = fVar186 * fVar116 - fVar201 * (float)local_aa8._4_4_;
                  auVar237._8_4_ = fVar191 * fVar148 - fVar203 * (float)local_aa8._8_4_;
                  auVar237._12_4_ = fVar199 * fVar180 - fVar207 * fStack_a9c;
                  auVar89._4_4_ =
                       -(uint)((float)((uint)(fVar214 * fVar186) & uVar114) <
                              (float)((uint)(fVar201 * (float)local_aa8._4_4_) & uVar114));
                  auVar89._0_4_ =
                       -(uint)((float)((uint)(fVar213 * fVar182) & uVar113) <
                              (float)((uint)(fVar198 * (float)local_aa8._0_4_) & uVar113));
                  auVar89._8_4_ =
                       -(uint)((float)((uint)(fStack_b10 * fVar191) & uVar115) <
                              (float)((uint)(fVar203 * (float)local_aa8._8_4_) & uVar115));
                  auVar89._12_4_ =
                       -(uint)((float)((uint)(fStack_b0c * fVar199) & uVar117) <
                              (float)((uint)(fVar207 * fStack_a9c) & uVar117));
                  hit.vNg.field_0.field_0.z.field_0 =
                       (vfloat_impl<4>)blendvps(auVar237,auVar249,auVar89);
                  fVar206 = fVar184 * hit.vNg.field_0._0_4_ +
                            fVar208 * hit.vNg.field_0._16_4_ + fStack_b90 * hit.vNg.field_0._32_4_;
                  fVar98 = fVar184 * hit.vNg.field_0._4_4_ +
                           fVar208 * hit.vNg.field_0._20_4_ + fStack_b90 * hit.vNg.field_0._36_4_;
                  fVar155 = fVar184 * hit.vNg.field_0._8_4_ +
                            fVar208 * hit.vNg.field_0._24_4_ + fStack_b90 * hit.vNg.field_0._40_4_;
                  fVar184 = fVar184 * hit.vNg.field_0._12_4_ +
                            fVar208 * hit.vNg.field_0._28_4_ + fStack_b90 * hit.vNg.field_0._44_4_;
                  auVar160._0_4_ = fVar206 + fVar206;
                  auVar160._4_4_ = fVar98 + fVar98;
                  auVar160._8_4_ = fVar155 + fVar155;
                  auVar160._12_4_ = fVar184 + fVar184;
                  auVar110._0_4_ =
                       local_ba8 * hit.vNg.field_0._16_4_ + fVar202 * hit.vNg.field_0._32_4_;
                  auVar110._4_4_ =
                       fStack_ba4 * hit.vNg.field_0._20_4_ + fVar240 * hit.vNg.field_0._36_4_;
                  auVar110._8_4_ =
                       fStack_ba0 * hit.vNg.field_0._24_4_ + fVar188 * hit.vNg.field_0._40_4_;
                  auVar110._12_4_ =
                       fStack_b9c * hit.vNg.field_0._28_4_ + fVar265 * hit.vNg.field_0._44_4_;
                  fVar155 = fVar185 * hit.vNg.field_0._0_4_ + auVar110._0_4_;
                  fVar164 = fVar177 * hit.vNg.field_0._4_4_ + auVar110._4_4_;
                  fVar181 = fVar97 * hit.vNg.field_0._8_4_ + auVar110._8_4_;
                  fVar185 = fVar196 * hit.vNg.field_0._12_4_ + auVar110._12_4_;
                  auVar247 = rcpps(auVar110,auVar160);
                  fVar206 = auVar247._0_4_;
                  fVar184 = auVar247._4_4_;
                  fVar208 = auVar247._8_4_;
                  fVar98 = auVar247._12_4_;
                  hit.vt.field_0.v[0] =
                       ((1.0 - auVar160._0_4_ * fVar206) * fVar206 + fVar206) * (fVar155 + fVar155);
                  hit.vt.field_0.v[1] =
                       ((1.0 - auVar160._4_4_ * fVar184) * fVar184 + fVar184) * (fVar164 + fVar164);
                  hit.vt.field_0.v[2] =
                       ((1.0 - auVar160._8_4_ * fVar208) * fVar208 + fVar208) * (fVar181 + fVar181);
                  hit.vt.field_0.v[3] =
                       ((1.0 - auVar160._12_4_ * fVar98) * fVar98 + fVar98) * (fVar185 + fVar185);
                  fVar206 = ray->tfar;
                  fVar184 = (ray->org).field_0.m128[3];
                  iVar76 = -(uint)(fVar184 <= hit.vt.field_0.v[1]);
                  iVar77 = -(uint)(fVar184 <= hit.vt.field_0.v[2]);
                  iVar78 = -(uint)(fVar184 <= hit.vt.field_0.v[3]);
                  auVar111._8_4_ = iVar77;
                  auVar111._4_4_ = iVar76;
                  auVar111._12_4_ = iVar78;
                  auVar161._0_4_ =
                       (int)((uint)(auVar160._0_4_ != 0.0 &&
                                   (hit.vt.field_0.v[0] <= fVar206 && fVar184 <= hit.vt.field_0.v[0]
                                   )) * -0x80000000) >> 0x1f;
                  auVar161._4_4_ =
                       (int)((uint)(auVar160._4_4_ != 0.0 &&
                                   (hit.vt.field_0.v[1] <= fVar206 && fVar184 <= hit.vt.field_0.v[1]
                                   )) * -0x80000000) >> 0x1f;
                  auVar161._8_4_ =
                       (int)((uint)(auVar160._8_4_ != 0.0 &&
                                   (hit.vt.field_0.v[2] <= fVar206 && fVar184 <= hit.vt.field_0.v[2]
                                   )) * -0x80000000) >> 0x1f;
                  auVar161._12_4_ =
                       (int)((uint)(auVar160._12_4_ != 0.0 &&
                                   (hit.vt.field_0.v[3] <= fVar206 && fVar184 <= hit.vt.field_0.v[3]
                                   )) * -0x80000000) >> 0x1f;
                  hit.valid.field_0 =
                       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar161 & auVar145);
                  iVar75 = movmskps(iVar75,(undefined1  [16])hit.valid.field_0);
                  if (iVar75 != 0) {
                    hit.mapUV = &mapUV;
                    auVar120._0_4_ = hit.UVW.field_0.v[0] - fVar100;
                    auVar120._4_4_ = hit.UVW.field_0.v[1] - fVar195;
                    auVar120._8_4_ = hit.UVW.field_0.v[2] - fVar146;
                    auVar120._12_4_ = hit.UVW.field_0.v[3] - fVar169;
                    auVar111._0_4_ = (float)(int)(*(ushort *)(local_b78 + 8 + (long)local_bb8) - 1);
                    auVar162._4_4_ = iVar76;
                    auVar162._0_4_ = auVar111._0_4_;
                    auVar162._8_4_ = iVar77;
                    auVar162._12_4_ = iVar78;
                    auVar247 = rcpss(auVar162,auVar111);
                    auVar175._4_12_ = DAT_01fec6c0._4_12_;
                    auVar175._0_4_ = (float)(int)(*(ushort *)(local_b78 + 10 + (long)local_bb8) - 1)
                    ;
                    fVar206 = (2.0 - auVar111._0_4_ * auVar247._0_4_) * auVar247._0_4_;
                    auVar163._4_4_ = uVar114;
                    auVar163._0_4_ = auVar175._0_4_;
                    auVar163._8_4_ = uVar115;
                    auVar163._12_4_ = uVar117;
                    auVar247 = rcpss(auVar163,auVar175);
                    fVar184 = (2.0 - auVar175._0_4_ * auVar247._0_4_) * auVar247._0_4_;
                    hit.U.field_0._0_4_ =
                         fVar206 * ((float)(int)local_b48._0_4_ * hit.UVW.field_0.v[0] +
                                   (hit.UVW.field_0.v[0] - fVar147));
                    hit.U.field_0._4_4_ =
                         fVar206 * ((float)(local_b48._0_4_ + 1) * hit.UVW.field_0.v[1] +
                                   (hit.UVW.field_0.v[1] - fVar150));
                    hit.U.field_0._8_4_ =
                         fVar206 * ((float)(local_b48._0_4_ + 1) * hit.UVW.field_0.v[2] +
                                   (hit.UVW.field_0.v[2] - fVar152));
                    hit.U.field_0._12_4_ =
                         fVar206 * ((float)(int)local_b48._0_4_ * hit.UVW.field_0.v[3] +
                                   (hit.UVW.field_0.v[3] - fVar154));
                    hit.V.field_0._0_4_ =
                         fVar184 * ((float)(int)local_b58._0_4_ * hit.UVW.field_0.v[0] +
                                   auVar120._0_4_);
                    hit.V.field_0._4_4_ =
                         fVar184 * ((float)(int)local_b58._0_4_ * hit.UVW.field_0.v[1] +
                                   auVar120._4_4_);
                    hit.V.field_0._8_4_ =
                         fVar184 * ((float)(local_b58._0_4_ + 1) * hit.UVW.field_0.v[2] +
                                   auVar120._8_4_);
                    hit.V.field_0._12_4_ =
                         fVar184 * ((float)(local_b58._0_4_ + 1) * hit.UVW.field_0.v[3] +
                                   auVar120._12_4_);
                    pGVar59 = (local_bb0->geometries).items[local_b70].ptr;
                    if ((pGVar59->mask & ray->mask) != 0) {
                      pRVar66 = local_bc0->args;
                      if ((pRVar66->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar59->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00238f69;
                      auVar43._4_4_ = hit.UVW.field_0.i[1];
                      auVar43._0_4_ = hit.UVW.field_0.i[0];
                      auVar43._8_4_ = hit.UVW.field_0.i[2];
                      auVar43._12_4_ = hit.UVW.field_0.i[3];
                      auVar247 = rcpps(auVar120,auVar43);
                      fVar206 = auVar247._0_4_;
                      fVar184 = auVar247._4_4_;
                      fVar208 = auVar247._8_4_;
                      fVar98 = auVar247._12_4_;
                      fVar206 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[0])) &
                                       (uint)(((float)DAT_01feca10 - hit.UVW.field_0.v[0] * fVar206)
                                              * fVar206 + fVar206));
                      fVar184 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[1])) &
                                       (uint)((DAT_01feca10._4_4_ - hit.UVW.field_0.v[1] * fVar184)
                                              * fVar184 + fVar184));
                      fVar208 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[2])) &
                                       (uint)((DAT_01feca10._8_4_ - hit.UVW.field_0.v[2] * fVar208)
                                              * fVar208 + fVar208));
                      fVar98 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[3])) &
                                      (uint)((DAT_01feca10._12_4_ - hit.UVW.field_0.v[3] * fVar98) *
                                             fVar98 + fVar98));
                      auVar90._0_4_ = hit.U.field_0._0_4_ * fVar206;
                      auVar90._4_4_ = hit.U.field_0._4_4_ * fVar184;
                      auVar90._8_4_ = hit.U.field_0._8_4_ * fVar208;
                      auVar90._12_4_ = hit.U.field_0._12_4_ * fVar98;
                      hit.vu.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar90,_DAT_01feca10);
                      auVar112._0_4_ = hit.V.field_0._0_4_ * fVar206;
                      auVar112._4_4_ = hit.V.field_0._4_4_ * fVar184;
                      auVar112._8_4_ = hit.V.field_0._8_4_ * fVar208;
                      auVar112._12_4_ = hit.V.field_0._12_4_ * fVar98;
                      hit.vv.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar112,_DAT_01feca10);
                      iVar75 = movmskps((int)local_bc0,(undefined1  [16])hit.valid.field_0);
                      local_bb0 = (Scene *)CONCAT44((int)((ulong)local_bc0 >> 0x20),iVar75);
                      local_b98 = 0;
                      if (local_bb0 != (Scene *)0x0) {
                        for (; ((ulong)local_bb0 >> local_b98 & 1) == 0; local_b98 = local_b98 + 1)
                        {
                        }
                      }
                      local_b58[0] = iVar75 == 0;
                      if (iVar75 != 0) {
                        pRVar26 = local_bc0->user;
                        local_b48._0_8_ = pRVar66;
                        local_bb8 = pGVar59;
                        fStack_b8c = fStack_b90;
                        do {
                          h.u = hit.vu.field_0.v[local_b98];
                          h.v = hit.vv.field_0.v[local_b98];
                          local_b78 = CONCAT44(local_b78._4_4_,ray->tfar);
                          ray->tfar = hit.vt.field_0.v[local_b98];
                          h.Ng.field_0.field_0.x =
                               *(float *)((long)&hit.vNg.field_0 + local_b98 * 4);
                          h.Ng.field_0.field_0.y =
                               *(float *)((long)&hit.vNg.field_0 + local_b98 * 4 + 0x10);
                          h.Ng.field_0.field_0.z =
                               *(float *)((long)&hit.vNg.field_0 + local_b98 * 4 + 0x20);
                          h.geomID = (uint)local_b70;
                          h.instID[0] = pRVar26->instID[0];
                          h.instPrimID[0] = pRVar26->instPrimID[0];
                          local_bdc = -1;
                          args.valid = &local_bdc;
                          args.geometryUserPtr = pGVar59->userPtr;
                          args.hit = (RTCHitN *)&h;
                          args.N = 1;
                          h.primID = uVar99;
                          args.context = pRVar26;
                          args.ray = (RTCRayN *)ray;
                          if (pGVar59->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00238dd2:
                            if (pRVar66->filter != (RTCFilterFunctionN)0x0) {
                              if (((pRVar66->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar59->field_8).field_0x2 & 0x40) != 0)) {
                                (*pRVar66->filter)(&args);
                                pGVar59 = local_bb8;
                                pRVar66 = (RTCIntersectArguments *)local_b48._0_8_;
                                pNVar68 = local_bc8;
                                uVar57 = local_bd0;
                                uVar69 = local_bd8;
                              }
                              if (*args.valid == 0) goto LAB_00238e22;
                            }
                            if ((local_b58 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            goto LAB_00238f69;
                            break;
                          }
                          (*pGVar59->occlusionFilterN)(&args);
                          pGVar59 = local_bb8;
                          pRVar66 = (RTCIntersectArguments *)local_b48._0_8_;
                          pNVar68 = local_bc8;
                          uVar57 = local_bd0;
                          uVar69 = local_bd8;
                          if (*args.valid != 0) goto LAB_00238dd2;
LAB_00238e22:
                          ray->tfar = (float)local_b78;
                          local_bb0 = (Scene *)((ulong)local_bb0 ^ 1L << (local_b98 & 0x3f));
                          local_b98 = 0;
                          if (local_bb0 != (Scene *)0x0) {
                            for (; ((ulong)local_bb0 >> local_b98 & 1) == 0;
                                local_b98 = local_b98 + 1) {
                            }
                          }
                          local_b58[0] = local_bb0 == (Scene *)0x0;
                        } while (local_bb0 != (Scene *)0x0);
                      }
                    }
                  }
                }
                uVar60 = uVar60 & uVar60 - 1;
              } while (uVar60 != 0);
            }
            uVar54 = uVar54 + 1;
            bVar74 = uVar54 < uVar67;
          } while (uVar54 != uVar67);
        }
LAB_00238f69:
        iVar75 = 0;
        if (bVar74) {
          ray->tfar = -INFINITY;
          iVar75 = 3;
        }
      }
    } while (iVar75 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }